

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSerialReadInvert(uint gpio,uint invert)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_ESI;
  uint in_EDI;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d invert=%d\n",pcVar2,"gpioSerialReadInvert",(ulong)in_EDI,
            (ulong)in_ESI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,
              "gpioSerialReadInvert");
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    if (wfRx[in_EDI].mode == 1) {
      if (in_ESI < 2) {
        wfRx[in_EDI].field_4.s.invert = in_ESI;
        local_4 = 0;
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar1,"%s %s: bad invert level for gpio %d (%d)\n",pcVar2,"gpioSerialReadInvert",
                  (ulong)in_EDI,(ulong)in_ESI);
        }
        local_4 = -0x79;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: no serial read on gpio (%d)\n",pcVar2,"gpioSerialReadInvert",
                (ulong)in_EDI);
      }
      local_4 = -0x26;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad gpio (%d)\n",pcVar2,"gpioSerialReadInvert",(ulong)in_EDI);
    }
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int gpioSerialReadInvert(unsigned gpio, unsigned invert)
{
   DBG(DBG_USER, "gpio=%d invert=%d", gpio, invert);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   if ((invert < PI_BB_SER_NORMAL) ||
       (invert > PI_BB_SER_INVERT))
      SOFT_ERROR(PI_BAD_SER_INVERT,
         "bad invert level for gpio %d (%d)", gpio, invert);

   wfRx[gpio].s.invert = invert;

   return 0;
}